

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

OrderCancelReplaceRequest * __thiscall
Application::queryCancelReplaceRequest43
          (OrderCancelReplaceRequest *__return_storage_ptr__,Application *this)

{
  bool bVar1;
  Application *pAVar2;
  Application *pAVar3;
  Application local_231;
  FieldBase local_1d8;
  FieldBase local_180;
  FieldBase local_128;
  FieldBase local_d0;
  FieldBase local_78;
  
  pAVar2 = this;
  queryOrigClOrdID((OrigClOrdID *)((long)&local_231.super_Application._vptr_Application + 1),this);
  queryClOrdID((ClOrdID *)&local_1d8,pAVar2);
  pAVar2 = &local_231;
  local_231.super_Application._vptr_Application._0_1_ = 0x31;
  FIX::HandlInst::HandlInst((HandlInst *)&local_d0,(CHAR *)pAVar2);
  querySide((Side *)&local_128,pAVar2);
  FIX::TransactTime::TransactTime((TransactTime *)&local_180);
  queryOrdType((OrdType *)&local_78,pAVar2);
  pAVar2 = (Application *)((long)&local_231.super_Application._vptr_Application + 1);
  FIX43::OrderCancelReplaceRequest::OrderCancelReplaceRequest
            (__return_storage_ptr__,(OrigClOrdID *)pAVar2,(ClOrdID *)&local_1d8,
             (HandlInst *)&local_d0,(Side *)&local_128,(TransactTime *)&local_180,
             (OrdType *)&local_78);
  FIX::FieldBase::~FieldBase(&local_78);
  FIX::FieldBase::~FieldBase(&local_180);
  FIX::FieldBase::~FieldBase(&local_128);
  FIX::FieldBase::~FieldBase(&local_d0);
  FIX::FieldBase::~FieldBase(&local_1d8);
  FIX::FieldBase::~FieldBase
            ((FieldBase *)((long)&local_231.super_Application._vptr_Application + 1));
  querySymbol((Symbol *)((long)&local_231.super_Application._vptr_Application + 1),pAVar2);
  FIX43::OrderCancelReplaceRequest::set
            (__return_storage_ptr__,
             (Symbol *)((long)&local_231.super_Application._vptr_Application + 1));
  FIX::FieldBase::~FieldBase
            ((FieldBase *)((long)&local_231.super_Application._vptr_Application + 1));
  pAVar2 = (Application *)((long)&local_231.super_Application._vptr_Application + 1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pAVar2,"New price",(allocator<char> *)&local_1d8);
  pAVar3 = (Application *)((long)&local_231.super_Application._vptr_Application + 1);
  bVar1 = queryConfirm(pAVar2,(string *)pAVar3);
  std::__cxx11::string::~string
            ((string *)((long)&local_231.super_Application._vptr_Application + 1));
  if (bVar1) {
    queryPrice((Price *)((long)&local_231.super_Application._vptr_Application + 1),pAVar3);
    FIX43::OrderCancelReplaceRequest::set
              (__return_storage_ptr__,
               (Price *)((long)&local_231.super_Application._vptr_Application + 1));
    FIX::FieldBase::~FieldBase
              ((FieldBase *)((long)&local_231.super_Application._vptr_Application + 1));
  }
  pAVar2 = (Application *)((long)&local_231.super_Application._vptr_Application + 1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pAVar2,"New quantity",(allocator<char> *)&local_1d8);
  pAVar3 = (Application *)((long)&local_231.super_Application._vptr_Application + 1);
  bVar1 = queryConfirm(pAVar2,(string *)pAVar3);
  std::__cxx11::string::~string
            ((string *)((long)&local_231.super_Application._vptr_Application + 1));
  if (bVar1) {
    queryOrderQty((OrderQty *)((long)&local_231.super_Application._vptr_Application + 1),pAVar3);
    FIX43::OrderCancelReplaceRequest::set
              (__return_storage_ptr__,
               (OrderQty *)((long)&local_231.super_Application._vptr_Application + 1));
    FIX::FieldBase::~FieldBase
              ((FieldBase *)((long)&local_231.super_Application._vptr_Application + 1));
  }
  queryHeader(this,(Header *)&(__return_storage_ptr__->super_Message).field_0x70);
  return __return_storage_ptr__;
}

Assistant:

FIX43::OrderCancelReplaceRequest Application::queryCancelReplaceRequest43() {
  FIX43::OrderCancelReplaceRequest cancelReplaceRequest(
      queryOrigClOrdID(),
      queryClOrdID(),
      FIX::HandlInst('1'),
      querySide(),
      FIX::TransactTime(),
      queryOrdType());

  cancelReplaceRequest.set(querySymbol());
  if (queryConfirm("New price")) {
    cancelReplaceRequest.set(queryPrice());
  }
  if (queryConfirm("New quantity")) {
    cancelReplaceRequest.set(queryOrderQty());
  }

  queryHeader(cancelReplaceRequest.getHeader());
  return cancelReplaceRequest;
}